

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O3

void selectDisplayConnection(timeval *timeout)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  fd_set *__arr;
  fd_set fds;
  fd_set local_98;
  
  iVar1 = *(int *)(_glfw.x11.display + 0x10);
  local_98.fds_bits[0] = 0;
  local_98.fds_bits[1] = 0;
  local_98.fds_bits[2] = 0;
  local_98.fds_bits[3] = 0;
  local_98.fds_bits[4] = 0;
  local_98.fds_bits[5] = 0;
  local_98.fds_bits[6] = 0;
  local_98.fds_bits[7] = 0;
  local_98.fds_bits[8] = 0;
  local_98.fds_bits[9] = 0;
  local_98.fds_bits[10] = 0;
  local_98.fds_bits[0xb] = 0;
  iVar2 = iVar1 + 0x3f;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  local_98.fds_bits[0xc] = 0;
  local_98.fds_bits[0xd] = 0;
  local_98.fds_bits[0xe] = 0;
  local_98.fds_bits[0xf] = 0;
  local_98.fds_bits[iVar2 >> 6] =
       local_98.fds_bits[iVar2 >> 6] | 1L << ((byte)(iVar1 % 0x40) & 0x3f);
  while( true ) {
    iVar2 = select(iVar1 + 1,&local_98,(fd_set *)0x0,(fd_set *)0x0,(timeval *)timeout);
    if (iVar2 != -1) {
      return;
    }
    piVar3 = __errno_location();
    if (timeout != (timeval *)0x0) break;
    if (*piVar3 != 4) {
      return;
    }
  }
  return;
}

Assistant:

void selectDisplayConnection(struct timeval* timeout)
{
    fd_set fds;
    int result;
    const int fd = ConnectionNumber(_glfw.x11.display);

    FD_ZERO(&fds);
    FD_SET(fd, &fds);

    // NOTE: We use select instead of an X function like XNextEvent, as the
    //       wait inside those are guarded by the mutex protecting the display
    //       struct, locking out other threads from using X (including GLX)
    // NOTE: Only retry on EINTR if there is no timeout, as select is not
    //       required to update it for the time elapsed
    // TODO: Update timeout value manually
    do
    {
        result = select(fd + 1, &fds, NULL, NULL, timeout);
    }
    while (result == -1 && errno == EINTR && timeout == NULL);
}